

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  GenericStringRef<char> local_40;
  undefined1 local_30 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_40,(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_40,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<16u>
            (&local_50,(char (*) [16])"image2DViewOf3D");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_50,create_info->image2DViewOf3D,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<18u>
            (&local_60,(char (*) [18])"sampler2DViewOf3D");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_60,create_info->sampler2DViewOf3D,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
  return true;
}

Assistant:

static bool json_value(const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("image2DViewOf3D", create_info.image2DViewOf3D, alloc);
	value.AddMember("sampler2DViewOf3D", create_info.sampler2DViewOf3D, alloc);
	*out_value = value;
	return true;
}